

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O1

void SoPlex_changeObjRational(void *soplex,long *objnums,long *objdenoms,int dim)

{
  void *pvVar1;
  long lVar2;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *this;
  long lVar3;
  ulong uVar4;
  VectorRational objective;
  data_type local_a8;
  undefined4 local_98;
  undefined2 local_94;
  char local_92;
  data_type local_88;
  undefined4 local_78;
  undefined2 local_74;
  char local_72;
  SoPlexBase<double> *local_60;
  ulong local_58;
  long *local_50;
  long *local_48;
  long local_40;
  long local_38;
  
  lVar2 = (long)dim * 0x40;
  uVar4 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar4 = lVar2 + 0x10;
  }
  local_60 = (SoPlexBase<double> *)soplex;
  local_50 = objnums;
  local_48 = objdenoms;
  pvVar1 = operator_new__(uVar4);
  *(long *)((long)pvVar1 + 8) = (long)dim;
  if (dim != 0) {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)pvVar1 + lVar3 + 0x10) = 0;
      *(undefined4 *)((long)pvVar1 + lVar3 + 0x20) = 1;
      *(undefined2 *)((long)pvVar1 + lVar3 + 0x24) = 0x100;
      *(undefined1 *)((long)pvVar1 + lVar3 + 0x26) = 0;
      *(undefined8 *)((long)pvVar1 + lVar3 + 0x30) = 1;
      *(undefined4 *)((long)pvVar1 + lVar3 + 0x40) = 1;
      *(undefined2 *)((long)pvVar1 + lVar3 + 0x44) = 0x100;
      *(undefined1 *)((long)pvVar1 + lVar3 + 0x46) = 0;
      lVar3 = lVar3 + 0x40;
    } while (lVar2 != lVar3);
  }
  if (0 < dim) {
    local_58 = (ulong)(uint)dim;
    this = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)((long)pvVar1 + 0x30);
    uVar4 = 0;
    do {
      local_a8.la[0] = 0;
      local_98 = 1;
      local_94 = 0x100;
      local_92 = '\0';
      local_88.la[0] = 1;
      local_78 = 1;
      local_74 = 0x100;
      local_72 = '\0';
      local_38 = local_50[uVar4];
      local_40 = local_48[uVar4];
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
      ::assign<long_long,long_long>
                ((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                  *)&local_a8.ld,&local_38,&local_40);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(this + -1,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_a8.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(this,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_88.ld);
      if ((local_74._1_1_ == '\0') && (local_72 == '\0')) {
        operator_delete(local_88.ld.data,(local_88.la[0] & 0xffffffff) << 3);
      }
      if ((local_94._1_1_ == '\0') && (local_92 == '\0')) {
        operator_delete(local_a8.ld.data,(local_a8.la[0] & 0xffffffff) << 3);
      }
      uVar4 = uVar4 + 1;
      this = this + 2;
    } while (local_58 != uVar4);
  }
  ::soplex::
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_a8.ld,dim,
               (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                *)((long)pvVar1 + 0x10));
  ::soplex::SoPlexBase<double>::changeObjRational(local_60,(VectorRational *)&local_a8.ld);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             *)&local_a8.ld);
  return;
}

Assistant:

void SoPlex_changeObjRational(void* soplex, long* objnums, long* objdenoms, int dim)
{
#ifndef SOPLEX_WITH_BOOST
   throw SPxException("Rational functions cannot be used when built without Boost.");
#endif
   /* coverity[unreachable] */
   SoPlex* so = (SoPlex*)(soplex);
   Rational* objrational = new Rational [dim];

   /* create rational objective vector */
   for(int i = 0; i < dim; ++i)
   {
      Rational objentry(objnums[i], objdenoms[i]);
      objrational[i] = objentry;
   }

   VectorRational objective(dim, objrational);
   so->changeObjRational(objective);
}